

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

btDbvtNode * topdown(btDbvt *pdbvt,tNodeArray *leaves,int bu_treshold)

{
  int iVar1;
  btDbvtNode *pbVar2;
  btDbvtNode **ppbVar3;
  int in_EDX;
  btDbvt *in_RSI;
  btScalar bVar4;
  btVector3 bVar5;
  btDbvtNode *node;
  int ni;
  int i_1;
  int midp;
  int j;
  btVector3 x;
  int i;
  int splitcount [3] [2];
  int bestmidp;
  int bestaxis;
  tNodeArray sets [2];
  btVector3 org;
  btDbvtVolume vol;
  btVector3 *in_stack_fffffffffffffdc8;
  btAlignedObjectArray<btDbvtNode_*> *in_stack_fffffffffffffdd0;
  btDbvtNode *in_stack_fffffffffffffdd8;
  btDbvt *in_stack_fffffffffffffde0;
  undefined1 *puVar6;
  undefined1 *local_218;
  tNodeArray *in_stack_fffffffffffffe10;
  btVector3 *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  btScalar in_stack_fffffffffffffe24;
  tNodeArray *in_stack_fffffffffffffe28;
  tNodeArray *in_stack_fffffffffffffe30;
  tNodeArray *in_stack_fffffffffffffe38;
  btDbvt *in_stack_fffffffffffffe40;
  undefined1 *local_130;
  int local_118;
  int local_110;
  int local_ec;
  int local_e8 [6];
  int local_d0;
  int local_cc;
  undefined1 local_c8 [64];
  undefined1 auStack_88 [12];
  undefined8 local_7c;
  undefined8 local_74;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38 [4];
  btScalar local_28;
  btScalar in_stack_ffffffffffffffdc;
  btScalar in_stack_ffffffffffffffe0;
  btDbvtNode *local_8;
  
  if ((topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis == '\0') &&
     (iVar1 = __cxa_guard_acquire(&topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis),
     iVar1 != 0)) {
    in_stack_ffffffffffffffe0 = 1.0;
    in_stack_ffffffffffffffdc = 0.0;
    local_28 = 0.0;
    btVector3::btVector3
              (topdown::axis,(btScalar *)&stack0xffffffffffffffe0,
               (btScalar *)&stack0xffffffffffffffdc,&local_28);
    local_38[0] = 0.0;
    local_3c = 1.0;
    local_40 = 0.0;
    btVector3::btVector3(topdown::axis + 1,local_38,&local_3c,&local_40);
    local_44 = 0.0;
    local_48 = 0.0;
    local_4c = 1.0;
    btVector3::btVector3(topdown::axis + 2,&local_44,&local_48,&local_4c);
    __cxa_guard_release(&topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis);
  }
  iVar1 = btAlignedObjectArray<btDbvtNode_*>::size((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
  if (iVar1 < 2) {
    ppbVar3 = btAlignedObjectArray<btDbvtNode_*>::operator[]
                        ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI,0);
    local_8 = *ppbVar3;
  }
  else {
    iVar1 = btAlignedObjectArray<btDbvtNode_*>::size((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
    if (in_EDX < iVar1) {
      bounds(in_stack_fffffffffffffe10);
      bVar5 = btDbvtAabbMm::Center((btDbvtAabbMm *)in_stack_fffffffffffffde0);
      local_7c = bVar5.m_floats._0_8_;
      local_74 = bVar5.m_floats._8_8_;
      local_130 = local_c8;
      do {
        btAlignedObjectArray<btDbvtNode_*>::btAlignedObjectArray(in_stack_fffffffffffffdd0);
        local_130 = local_130 + 0x20;
      } while (local_130 != auStack_88);
      local_cc = -1;
      local_d0 = btAlignedObjectArray<btDbvtNode_*>::size
                           ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
      memset(local_e8,0,0x18);
      for (local_ec = 0;
          iVar1 = btAlignedObjectArray<btDbvtNode_*>::size
                            ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI), local_ec < iVar1;
          local_ec = local_ec + 1) {
        btAlignedObjectArray<btDbvtNode_*>::operator[]
                  ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI,local_ec);
        btDbvtAabbMm::Center((btDbvtAabbMm *)in_stack_fffffffffffffde0);
        operator-((btVector3 *)in_stack_fffffffffffffde0,(btVector3 *)in_stack_fffffffffffffdd8);
        for (local_110 = 0; local_110 < 3; local_110 = local_110 + 1) {
          bVar4 = btDot((btVector3 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          local_e8[(long)local_110 * 2 + (long)(int)(uint)(0.0 < bVar4)] =
               local_e8[(long)local_110 * 2 + (long)(int)(uint)(0.0 < bVar4)] + 1;
        }
      }
      for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
        if ((0 < local_e8[(long)local_ec * 2]) && (0 < local_e8[(long)local_ec * 2 + 1])) {
          in_stack_fffffffffffffe24 =
               btFabs((float)(local_e8[(long)local_ec * 2] - local_e8[(long)local_ec * 2 + 1]));
          if ((int)in_stack_fffffffffffffe24 < local_d0) {
            local_cc = local_ec;
            local_d0 = (int)in_stack_fffffffffffffe24;
          }
        }
      }
      if (local_cc < 0) {
        btAlignedObjectArray<btDbvtNode_*>::size((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
        btAlignedObjectArray<btDbvtNode_*>::reserve
                  ((btAlignedObjectArray<btDbvtNode_*> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        btAlignedObjectArray<btDbvtNode_*>::size((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
        btAlignedObjectArray<btDbvtNode_*>::reserve
                  ((btAlignedObjectArray<btDbvtNode_*> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        local_118 = 0;
        iVar1 = btAlignedObjectArray<btDbvtNode_*>::size
                          ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI);
        for (; local_118 < iVar1; local_118 = local_118 + 1) {
          btAlignedObjectArray<btDbvtNode_*>::operator[]
                    ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI,local_118);
          btAlignedObjectArray<btDbvtNode_*>::push_back
                    ((btAlignedObjectArray<btDbvtNode_*> *)in_stack_fffffffffffffde0,
                     (btDbvtNode **)in_stack_fffffffffffffdd8);
        }
      }
      else {
        btAlignedObjectArray<btDbvtNode_*>::reserve
                  ((btAlignedObjectArray<btDbvtNode_*> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        btAlignedObjectArray<btDbvtNode_*>::reserve
                  ((btAlignedObjectArray<btDbvtNode_*> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        split(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
              (tNodeArray *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              in_stack_fffffffffffffe18,(btVector3 *)in_stack_fffffffffffffe10);
      }
      local_8 = createnode(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                           (btDbvtVolume *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pbVar2 = topdown(in_RSI,(tNodeArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (int)in_stack_ffffffffffffffdc);
      (local_8->field_2).childs[0] = pbVar2;
      pbVar2 = topdown(in_RSI,(tNodeArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (int)in_stack_ffffffffffffffdc);
      (local_8->field_2).childs[1] = pbVar2;
      (local_8->field_2).childs[0]->parent = local_8;
      (local_8->field_2).childs[1]->parent = local_8;
      puVar6 = local_c8;
      local_218 = auStack_88;
      do {
        local_218 = local_218 + -0x20;
        btAlignedObjectArray<btDbvtNode_*>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btDbvtNode_*> *)0x15d769);
      } while (local_218 != puVar6);
    }
    else {
      bottomup(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ppbVar3 = btAlignedObjectArray<btDbvtNode_*>::operator[]
                          ((btAlignedObjectArray<btDbvtNode_*> *)in_RSI,0);
      local_8 = *ppbVar3;
    }
  }
  return local_8;
}

Assistant:

static btDbvtNode*			topdown(btDbvt* pdbvt,
									tNodeArray& leaves,
									int bu_treshold)
{
	static const btVector3	axis[]={btVector3(1,0,0),
		btVector3(0,1,0),
		btVector3(0,0,1)};
	if(leaves.size()>1)
	{
		if(leaves.size()>bu_treshold)
		{
			const btDbvtVolume	vol=bounds(leaves);
			const btVector3			org=vol.Center();
			tNodeArray				sets[2];
			int						bestaxis=-1;
			int						bestmidp=leaves.size();
			int						splitcount[3][2]={{0,0},{0,0},{0,0}};
			int i;
			for( i=0;i<leaves.size();++i)
			{
				const btVector3	x=leaves[i]->volume.Center()-org;
				for(int j=0;j<3;++j)
				{
					++splitcount[j][btDot(x,axis[j])>0?1:0];
				}
			}
			for( i=0;i<3;++i)
			{
				if((splitcount[i][0]>0)&&(splitcount[i][1]>0))
				{
					const int	midp=(int)btFabs(btScalar(splitcount[i][0]-splitcount[i][1]));
					if(midp<bestmidp)
					{
						bestaxis=i;
						bestmidp=midp;
					}
				}
			}
			if(bestaxis>=0)
			{
				sets[0].reserve(splitcount[bestaxis][0]);
				sets[1].reserve(splitcount[bestaxis][1]);
				split(leaves,sets[0],sets[1],org,axis[bestaxis]);
			}
			else
			{
				sets[0].reserve(leaves.size()/2+1);
				sets[1].reserve(leaves.size()/2);
				for(int i=0,ni=leaves.size();i<ni;++i)
				{
					sets[i&1].push_back(leaves[i]);
				}
			}
			btDbvtNode*	node=createnode(pdbvt,0,vol,0);
			node->childs[0]=topdown(pdbvt,sets[0],bu_treshold);
			node->childs[1]=topdown(pdbvt,sets[1],bu_treshold);
			node->childs[0]->parent=node;
			node->childs[1]->parent=node;
			return(node);
		}
		else
		{
			bottomup(pdbvt,leaves);
			return(leaves[0]);
		}
	}
	return(leaves[0]);
}